

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O0

long sd_order(int child,long skip_count)

{
  undefined4 in_EDI;
  long unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  
  NthElement(unaff_retaddr,(long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  NthElement(unaff_retaddr,(long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  NthElement(unaff_retaddr,(long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  NthElement(unaff_retaddr,(long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  NthElement(unaff_retaddr,(long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  NthElement(unaff_retaddr,(long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  NthElement(unaff_retaddr,(long *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  return 0;
}

Assistant:

long 
sd_order(int child, long skip_count)        
{
   UNUSED(child);
   ADVANCE_STREAM(O_LCNT_SD, skip_count);
   ADVANCE_STREAM(O_CKEY_SD, skip_count);
   FAKE_V_STR(O_CMNT_LEN, O_CMNT_SD, skip_count);
   ADVANCE_STREAM(O_SUPP_SD, skip_count);
   ADVANCE_STREAM(O_CLRK_SD, skip_count);
   ADVANCE_STREAM(O_PRIO_SD, skip_count);
   ADVANCE_STREAM(O_ODATE_SD, skip_count);

   return (0L);
}